

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parg.hh
# Opt level: O3

void __thiscall OB::Parg::set(Parg *this,string *_name,string *_default,string *_arg,string *_info)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
  *pmVar1;
  long lVar2;
  mapped_type *pmVar3;
  mapped_type *pmVar4;
  long *plVar5;
  undefined8 *puVar6;
  ostream *poVar7;
  long *plVar8;
  pointer pbVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  size_type *psVar11;
  undefined8 uVar12;
  undefined1 auVar13 [8];
  undefined1 local_2d8 [8];
  stringstream out;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c8 [7];
  ios_base local_258 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  long *local_130;
  long local_128;
  long local_120;
  long lStack_118;
  long *local_110;
  long local_108;
  long local_100;
  long lStack_f8;
  string *local_f0;
  undefined1 local_e8 [8];
  string delim;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  undefined1 local_a0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  undefined1 local_50 [8];
  string _short;
  
  local_e8 = (undefined1  [8])&delim._M_string_length;
  local_f0 = _info;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,",","");
  lVar2 = std::__cxx11::string::find((char *)_name,(ulong)local_e8,0);
  if (lVar2 == -1) {
    if (_name->_M_string_length == 1) {
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this->flags_,_name);
      std::__cxx11::string::_M_assign((string *)pmVar3);
      pmVar1 = &this->data_;
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
               ::operator[](pmVar1,_name);
      std::__cxx11::string::_M_assign((string *)&pmVar4->long_);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
               ::operator[](pmVar1,_name);
      std::__cxx11::string::_M_assign((string *)pmVar4);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
               ::operator[](pmVar1,_name);
      pmVar4->mode_ = false;
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
               ::operator[](pmVar1,_name);
      std::__cxx11::string::_M_assign((string *)&pmVar4->value_);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_a0 + 0x10),"  -",_name);
      plVar5 = (long *)std::__cxx11::string::append(local_a0 + 0x10);
      local_70 = &local_60;
      plVar8 = plVar5 + 2;
      if ((long *)*plVar5 == plVar8) {
        local_60 = *plVar8;
        lStack_58 = plVar5[3];
      }
      else {
        local_60 = *plVar8;
        local_70 = (long *)*plVar5;
      }
      local_68 = plVar5[1];
      *plVar5 = (long)plVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_70,(ulong)(_arg->_M_dataplus)._M_p);
      local_50 = (undefined1  [8])&_short._M_string_length;
      psVar11 = (size_type *)(plVar5 + 2);
      if ((size_type *)*plVar5 == psVar11) {
        _short._M_string_length = *psVar11;
        _short.field_2._M_allocated_capacity = plVar5[3];
      }
      else {
        _short._M_string_length = *psVar11;
        local_50 = (undefined1  [8])*plVar5;
      }
      _short._M_dataplus._M_p = (pointer)plVar5[1];
      *plVar5 = (long)psVar11;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append(local_50);
      local_2d8 = (undefined1  [8])local_2c8;
      paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 == paVar10) {
        local_2c8[0]._0_8_ = paVar10->_M_allocated_capacity;
        local_2c8[0]._8_8_ = plVar5[3];
      }
      else {
        local_2c8[0]._0_8_ = paVar10->_M_allocated_capacity;
        local_2d8 = (undefined1  [8])*plVar5;
      }
      _out = plVar5[1];
      *plVar5 = (long)paVar10;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&this->options_,(ulong)local_2d8);
    }
    else {
      pmVar1 = &this->data_;
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
               ::operator[](pmVar1,_name);
      std::__cxx11::string::_M_assign((string *)&pmVar4->long_);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
               ::operator[](pmVar1,_name);
      pmVar4->mode_ = false;
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
               ::operator[](pmVar1,_name);
      std::__cxx11::string::_M_assign((string *)&pmVar4->value_);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_a0 + 0x10),"  --",_name);
      puVar6 = (undefined8 *)std::__cxx11::string::append(local_a0 + 0x10);
      local_70 = &local_60;
      plVar5 = puVar6 + 2;
      if ((long *)*puVar6 == plVar5) {
        local_60 = *plVar5;
        lStack_58 = puVar6[3];
      }
      else {
        local_60 = *plVar5;
        local_70 = (long *)*puVar6;
      }
      local_68 = puVar6[1];
      *puVar6 = plVar5;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_70,(ulong)(_arg->_M_dataplus)._M_p);
      local_50 = (undefined1  [8])&_short._M_string_length;
      psVar11 = (size_type *)(plVar5 + 2);
      if ((size_type *)*plVar5 == psVar11) {
        _short._M_string_length = *psVar11;
        _short.field_2._M_allocated_capacity = plVar5[3];
      }
      else {
        _short._M_string_length = *psVar11;
        local_50 = (undefined1  [8])*plVar5;
      }
      _short._M_dataplus._M_p = (pointer)plVar5[1];
      *plVar5 = (long)psVar11;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append(local_50);
      local_2d8 = (undefined1  [8])local_2c8;
      paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 == paVar10) {
        local_2c8[0]._0_8_ = paVar10->_M_allocated_capacity;
        local_2c8[0]._8_8_ = plVar5[3];
      }
      else {
        local_2c8[0]._0_8_ = paVar10->_M_allocated_capacity;
        local_2d8 = (undefined1  [8])*plVar5;
      }
      _out = plVar5[1];
      *plVar5 = (long)paVar10;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&this->options_,(ulong)local_2d8);
    }
    if (local_2d8 != (undefined1  [8])local_2c8) {
      operator_delete((void *)local_2d8,local_2c8[0]._M_allocated_capacity + 1);
    }
    if (local_50 != (undefined1  [8])&_short._M_string_length) {
      operator_delete((void *)local_50,_short._M_string_length + 1);
    }
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    uVar12 = local_80._M_allocated_capacity;
    auVar13 = (undefined1  [8])local_a0._16_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._16_8_ == &local_80) goto LAB_0010e337;
  }
  else {
    local_2d8 = (undefined1  [8])local_2c8;
    _out = 0;
    local_2c8[0]._M_allocated_capacity = local_2c8[0]._M_allocated_capacity & 0xffffffffffffff00;
    local_50 = (undefined1  [8])&_short._M_string_length;
    _short._M_dataplus._M_p = (pointer)0x0;
    _short._M_string_length = _short._M_string_length & 0xffffffffffffff00;
    delimit((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&delim.field_2 + 8),this,_name,(string *)local_e8);
    if ((names.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start == (pointer)delim.field_2._8_8_) ||
       (0x40 < (ulong)((long)names.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start - delim.field_2._8_8_))) {
      __assert_fail("names.size() >= 1 && names.size() <= 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/octobanana[P]hr/src/ob/parg.hh"
                    ,0x16f,
                    "void OB::Parg::set(const std::string &, const std::string &, const std::string &, const std::string &)"
                   );
    }
    std::__cxx11::string::_M_assign((string *)local_2d8);
    if ((long)names.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start - delim.field_2._8_8_ == 0x40) {
      if (*(long *)(delim.field_2._8_8_ + 0x28) != 1) {
        __assert_fail("names.at(1).size() == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/octobanana[P]hr/src/ob/parg.hh"
                      ,0x176,
                      "void OB::Parg::set(const std::string &, const std::string &, const std::string &, const std::string &)"
                     );
      }
      std::__cxx11::string::_M_assign((string *)local_50);
    }
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->flags_,(key_type *)local_50);
    std::__cxx11::string::_M_assign((string *)pmVar3);
    pmVar1 = &this->data_;
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
             ::operator[](pmVar1,(key_type *)local_2d8);
    std::__cxx11::string::_M_assign((string *)&pmVar4->long_);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
             ::operator[](pmVar1,(key_type *)local_2d8);
    std::__cxx11::string::_M_assign((string *)pmVar4);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
             ::operator[](pmVar1,(key_type *)local_2d8);
    pmVar4->mode_ = false;
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
             ::operator[](pmVar1,(key_type *)local_2d8);
    std::__cxx11::string::_M_assign((string *)&pmVar4->value_);
    std::operator+(&local_150,"  -",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_150);
    plVar8 = plVar5 + 2;
    if ((long *)*plVar5 == plVar8) {
      local_100 = *plVar8;
      lStack_f8 = plVar5[3];
      local_110 = &local_100;
    }
    else {
      local_100 = *plVar8;
      local_110 = (long *)*plVar5;
    }
    local_108 = plVar5[1];
    *plVar5 = (long)plVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_2d8);
    names.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_a0;
    pbVar9 = (pointer)(plVar5 + 2);
    if ((pointer)*plVar5 == pbVar9) {
      local_a0._0_8_ = (pbVar9->_M_dataplus)._M_p;
      local_a0._8_8_ = plVar5[3];
    }
    else {
      local_a0._0_8_ = (pbVar9->_M_dataplus)._M_p;
      names.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*plVar5;
    }
    *plVar5 = (long)pbVar9;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append
                               ((char *)&names.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    plVar8 = plVar5 + 2;
    if ((long *)*plVar5 == plVar8) {
      local_120 = *plVar8;
      lStack_118 = plVar5[3];
      local_130 = &local_120;
    }
    else {
      local_120 = *plVar8;
      local_130 = (long *)*plVar5;
    }
    local_128 = plVar5[1];
    *plVar5 = (long)plVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_130,(ulong)(_arg->_M_dataplus)._M_p);
    paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 == paVar10) {
      local_80._M_allocated_capacity = paVar10->_M_allocated_capacity;
      local_80._8_8_ = plVar5[3];
      local_a0._16_8_ = &local_80;
    }
    else {
      local_80._M_allocated_capacity = paVar10->_M_allocated_capacity;
      local_a0._16_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar5;
    }
    local_a0._24_8_ = plVar5[1];
    *plVar5 = (long)paVar10;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    puVar6 = (undefined8 *)std::__cxx11::string::append(local_a0 + 0x10);
    plVar5 = puVar6 + 2;
    if ((long *)*puVar6 == plVar5) {
      local_60 = *plVar5;
      lStack_58 = puVar6[3];
      local_70 = &local_60;
    }
    else {
      local_60 = *plVar5;
      local_70 = (long *)*puVar6;
    }
    local_68 = puVar6[1];
    *puVar6 = plVar5;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&this->options_,(ulong)local_70);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._16_8_ != &local_80) {
      operator_delete((void *)local_a0._16_8_,local_80._M_allocated_capacity + 1);
    }
    if (local_130 != &local_120) {
      operator_delete(local_130,local_120 + 1);
    }
    if (names.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)local_a0) {
      operator_delete(names.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)(local_a0._0_8_ + 1)
                     );
    }
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&delim.field_2 + 8));
    if (local_50 != (undefined1  [8])&_short._M_string_length) {
      operator_delete((void *)local_50,_short._M_string_length + 1);
    }
    uVar12 = local_2c8[0]._M_allocated_capacity;
    auVar13 = local_2d8;
    if (local_2d8 == (undefined1  [8])local_2c8) goto LAB_0010e337;
  }
  operator_delete((void *)auVar13,uVar12 + 1);
LAB_0010e337:
  std::__cxx11::stringstream::stringstream((stringstream *)local_2d8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2c8[0]._M_local_buf,"    ",4);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_2c8[0]._M_local_buf,(local_f0->_M_dataplus)._M_p,
                      local_f0->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::_M_append((char *)&this->options_,(ulong)local_50);
  if (local_50 != (undefined1  [8])&_short._M_string_length) {
    operator_delete((void *)local_50,_short._M_string_length + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_2d8);
  std::ios_base::~ios_base(local_258);
  if (local_e8 != (undefined1  [8])&delim._M_string_length) {
    operator_delete((void *)local_e8,delim._M_string_length + 1);
  }
  return;
}

Assistant:

void set(std::string const& _name, std::string const& _default,
    std::string const& _arg, std::string const& _info)
  {
    // sets an option
    std::string delim {","};
    if (_name.find(delim) != std::string::npos)
    {
      bool has_short {false};
      std::string _long;
      std::string _short;

      auto const names = delimit(_name, delim);
      assert(names.size() >= 1 && names.size() <= 2);
      _long = names.at(0);

      if (names.size() == 2) has_short = true;
      if (has_short)
      {
        // short name must be one char
        assert(names.at(1).size() == 1);
        _short = names.at(1);
      }

      flags_[_short] = _long;
      data_[_long].long_ = _long;
      data_[_long].short_ = _short;
      data_[_long].mode_ = false;
      data_[_long].value_ = _default;
      options_.append("  -" + _short + ", --" + _long + "=<" + _arg + ">\n");
    }
    else
    {
      if (_name.size() == 1)
      {
        // short
        flags_[_name] = _name;
        data_[_name].long_ = _name;
        data_[_name].short_ = _name;
        data_[_name].mode_ = false;
        data_[_name].value_ = _default;
        options_.append("  -" + _name + "=<" + _arg + ">\n");
      }
      else
      {
        // long
        data_[_name].long_ = _name;
        data_[_name].mode_ = false;
        data_[_name].value_ = _default;
        options_.append("  --" + _name + "=<" + _arg + ">\n");
      }
    }

    std::stringstream out;
    out << "    " << _info << "\n";
    options_.append(out.str());
  }